

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

string * __thiscall
helics::Federate::query_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  element_type *peVar1;
  int iVar2;
  char *__s1;
  size_t __n;
  size_type __rlen;
  string local_50;
  
  __s1 = target._M_str;
  __n = target._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (__n == 0) {
LAB_0024ee91:
    query_abi_cxx11_(&local_50,this,queryStr,HELICS_SEQUENCING_MODE_FAST);
    query_abi_cxx11_();
  }
  else {
    if (__n == 8) {
      iVar2 = bcmp(__s1,"federate",8);
      if (iVar2 == 0) goto LAB_0024ee91;
    }
    if ((this->mName)._M_string_length == __n) {
      iVar2 = bcmp(__s1,(this->mName)._M_dataplus._M_p,__n);
      if (iVar2 == 0) goto LAB_0024ee91;
    }
    peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_Core[0x5e])(&local_50,peVar1,__n,__s1,queryStr._M_len,queryStr._M_str,mode);
    query_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    Federate::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    std::string res;
    if ((target.empty()) || (target == "federate") || (target == getName())) {
        res = query(queryStr);
    } else {
        res = coreObject->query(target, queryStr, mode);
    }
    return res;
}